

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskImageImplementation.hpp
# Opt level: O2

void __thiscall
Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>::~DiskImageHolder
          (DiskImageHolder<Storage::Disk::WOZ> *this)

{
  AsyncTaskQueue<true,_true,_void> *this_00;
  
  (this->super_DiskImageHolderBase).super_Disk._vptr_Disk =
       (_func_int **)&PTR__DiskImageHolder_0057ba00;
  (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)&DAT_0057ba60;
  this_00 = (this->super_DiskImageHolderBase).update_queue_._M_t.
            super___uniq_ptr_impl<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Concurrency::AsyncTaskQueue<true,_true,_void>_*,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
            .super__Head_base<0UL,_Concurrency::AsyncTaskQueue<true,_true,_void>_*,_false>.
            _M_head_impl;
  if (this_00 != (AsyncTaskQueue<true,_true,_void> *)0x0) {
    Concurrency::AsyncTaskQueue<true,_true,_void>::flush(this_00);
  }
  WOZ::~WOZ(&this->disk_image_);
  DiskImageHolderBase::~DiskImageHolderBase(&this->super_DiskImageHolderBase);
  return;
}

Assistant:

DiskImageHolder<T>::~DiskImageHolder() {
	if(update_queue_) update_queue_->flush();
}